

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guiddatabase.cpp
# Opt level: O0

GuidDatabase *
guidDatabaseFromTreeRecursive
          (GuidDatabase *__return_storage_ptr__,TreeModel *model,UModelIndex index)

{
  UModelIndex index_00;
  int iVar1;
  bool bVar2;
  UINT8 UVar3;
  int iVar4;
  TreeModel *__s;
  EFI_GUID_ *v;
  mapped_type *this;
  byte local_162;
  UByteArray local_118;
  UByteArray local_f8;
  EFI_GUID_ local_d8;
  CBString local_c8;
  byte local_a9;
  CBString local_a8;
  _Base_ptr local_90;
  _Rb_tree_iterator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_> local_88;
  TreeModel local_80;
  TreeModel *local_70;
  undefined1 local_68 [8];
  GuidDatabase tmpDb;
  int i;
  TreeModel *model_local;
  GuidDatabase *db;
  
  std::
  map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
  ::map(__return_storage_ptr__);
  bVar2 = UModelIndex::isValid(&index);
  if (bVar2) {
    for (tmpDb._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        iVar1 = tmpDb._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
        iVar4 = TreeModel::rowCount(model,&index), iVar1 < iVar4;
        tmpDb._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             tmpDb._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
      __s = UModelIndex::model(&index);
      iVar1 = tmpDb._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      UModelIndex::column(&index);
      TreeModel::index(&local_80,(char *)__s,iVar1);
      index_00.i._0_1_ = local_80.markingEnabledFlag;
      index_00.i._1_1_ = local_80.markingDarkModeFlag;
      index_00.i._2_6_ = local_80._10_6_;
      index_00._0_8_ = local_80.rootItem;
      index_00.m = local_70;
      guidDatabaseFromTreeRecursive((GuidDatabase *)local_68,model,index_00);
      local_88._M_node =
           (_Base_ptr)
           std::
           map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
           ::begin((map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
                    *)local_68);
      local_90 = (_Base_ptr)
                 std::
                 map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
                 ::end((map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
                        *)local_68);
      std::
      map<EFI_GUID_,Bstrlib::CBString,OperatorLessForGuids,std::allocator<std::pair<EFI_GUID_const,Bstrlib::CBString>>>
      ::insert<std::_Rb_tree_iterator<std::pair<EFI_GUID_const,Bstrlib::CBString>>>
                ((map<EFI_GUID_,Bstrlib::CBString,OperatorLessForGuids,std::allocator<std::pair<EFI_GUID_const,Bstrlib::CBString>>>
                  *)__return_storage_ptr__,local_88,
                 (_Rb_tree_iterator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>)local_90);
      std::
      map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
      ::~map((map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
              *)local_68);
    }
    local_a9 = 0;
    UVar3 = TreeModel::type(model,&index);
    local_162 = 0;
    if (UVar3 == 'B') {
      TreeModel::text(&local_a8,model,&index);
      local_a9 = 1;
      bVar2 = Bstrlib::CBString::isEmpty(&local_a8);
      local_162 = bVar2 ^ 0xff;
    }
    if ((local_a9 & 1) != 0) {
      Bstrlib::CBString::~CBString(&local_a8);
    }
    if ((local_162 & 1) != 0) {
      TreeModel::text(&local_c8,model,&index);
      TreeModel::header(&local_118,model,&index);
      UByteArray::left(&local_f8,&local_118,0x10);
      v = (EFI_GUID_ *)UByteArray::constData(&local_f8);
      local_d8 = readUnaligned<EFI_GUID_>(v);
      this = std::
             map<EFI_GUID_,_Bstrlib::CBString,_OperatorLessForGuids,_std::allocator<std::pair<const_EFI_GUID_,_Bstrlib::CBString>_>_>
             ::operator[](__return_storage_ptr__,&local_d8);
      Bstrlib::CBString::operator=(this,&local_c8);
      UByteArray::~UByteArray(&local_f8);
      UByteArray::~UByteArray(&local_118);
      Bstrlib::CBString::~CBString(&local_c8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

GuidDatabase guidDatabaseFromTreeRecursive(TreeModel * model, const UModelIndex index)
{
    GuidDatabase db;
    
    if (!index.isValid())
        return db;
    
    for (int i = 0; i < model->rowCount(index); i++) {
        GuidDatabase tmpDb = guidDatabaseFromTreeRecursive(model, index.model()->index(i, index.column(), index));
        
        db.insert(tmpDb.begin(), tmpDb.end());
    }
    
    if (model->type(index) == Types::File && !model->text(index).isEmpty())
        db[readUnaligned((const EFI_GUID*)model->header(index).left(16).constData())] = model->text(index);
    
    return db;
}